

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O3

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::level_of(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *this,size_t node_idx)

{
  ulong uVar1;
  pointer prVar2;
  size_t sVar3;
  
  uVar1 = (this->tree_).m_holder.m_size;
  if (node_idx < uVar1) {
    prVar2 = (this->tree_).m_holder.m_start;
    sVar3 = 0;
    do {
      if (prVar2[node_idx].is_leaf != false) {
        return sVar3;
      }
      if (prVar2[node_idx].entry.
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size == 0) {
        __assert_fail("!this->empty()","/usr/include/boost/container/vector.hpp",0x61a,
                      "const_reference boost::container::vector<unsigned long, boost::container::dtl::static_storage_allocator<unsigned long, 6, 0, true>>::front() const [T = unsigned long, A = boost::container::dtl::static_storage_allocator<unsigned long, 6, 0, true>, Options = void]"
                     );
      }
      sVar3 = sVar3 + 1;
      node_idx = *(size_t *)
                  &prVar2[node_idx].entry.
                   super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                   .m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage;
    } while (node_idx < uVar1);
  }
  boost::container::throw_out_of_range("vector::at out of range");
}

Assistant:

std::size_t level_of(std::size_t node_idx) const
    {
        std::size_t level = 0;
        while(!(tree_.at(node_idx).is_leaf))
        {
            ++level;
            node_idx = tree_.at(node_idx).entry.front();
        }
        return level;
    }